

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenGlobalInitializer::GetExecutableTestOutput
          (cmQtAutoGenGlobalInitializer *this,string *generator,string *executable,string *error,
          string *output)

{
  bool bVar1;
  iterator iVar2;
  string stdOut;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int retVal;
  string stdErr;
  string local_50;
  
  iVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->ExecutableTestOutputs_)._M_h,executable);
  if (output == (string *)0x0 ||
      iVar2.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    bVar1 = true;
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      bVar1 = cmsys::SystemTools::FileExists(executable,true);
      if (bVar1) {
        stdOut._M_dataplus._M_p = (pointer)&stdOut.field_2;
        stdOut._M_string_length = 0;
        stdErr._M_dataplus._M_p = (pointer)&stdErr.field_2;
        stdErr._M_string_length = 0;
        stdOut.field_2._M_local_buf[0] = '\0';
        stdErr.field_2._M_local_buf[0] = '\0';
        command.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        command.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        command.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&command,executable);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
                   (char (*) [3])"-h");
        retVal = 0;
        bVar1 = cmSystemTools::RunSingleCommand
                          (&command,&stdOut,&stdErr,&retVal,(char *)0x0,OUTPUT_NONE,(cmDuration)0x0,
                           Auto);
        if (bVar1) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&command);
          std::__cxx11::string::~string((string *)&stdErr);
          if (output != (string *)0x0) {
            std::__cxx11::string::_M_assign((string *)output);
          }
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::__cxx11::string_const&,std::__cxx11::string>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&this->ExecutableTestOutputs_,executable,&stdOut);
        }
        else {
          std::__cxx11::string::assign((char *)error);
          std::__cxx11::string::append((string *)error);
          std::__cxx11::string::append((char *)error);
          cmQtAutoGen::Quoted(&local_50,executable);
          std::operator+(&local_98,&local_50," failed.\n");
          std::__cxx11::string::append((string *)error);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_50);
          cmQtAutoGen::QuotedCommand(&local_98,&command);
          std::__cxx11::string::append((string *)error);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::append((char *)error);
          std::__cxx11::string::append((string *)error);
          std::__cxx11::string::append((char *)error);
          std::__cxx11::string::append((string *)error);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&command);
          std::__cxx11::string::~string((string *)&stdErr);
        }
        std::__cxx11::string::~string((string *)&stdOut);
      }
      else {
        std::__cxx11::string::assign((char *)error);
        std::__cxx11::string::append((string *)error);
        std::__cxx11::string::append((char *)error);
        cmQtAutoGen::Quoted(&stdOut,executable);
        std::__cxx11::string::append((string *)error);
        std::__cxx11::string::~string((string *)&stdOut);
        std::__cxx11::string::append((char *)error);
        bVar1 = false;
      }
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)output);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool cmQtAutoGenGlobalInitializer::GetExecutableTestOutput(
  std::string const& generator, std::string const& executable,
  std::string& error, std::string* output)
{
  // Check if we have cached output
  {
    auto it = this->ExecutableTestOutputs_.find(executable);
    if (it != this->ExecutableTestOutputs_.end()) {
      // Return output on demand
      if (output != nullptr) {
        *output = it->second;
      }
      return true;
    }
  }

  // Check if the executable exists
  if (!cmSystemTools::FileExists(executable, true)) {
    error = "The \"";
    error += generator;
    error += "\" executable ";
    error += cmQtAutoGen::Quoted(executable);
    error += " does not exist.";
    return false;
  }

  // Test the executable
  std::string stdOut;
  {
    std::string stdErr;
    std::vector<std::string> command;
    command.push_back(executable);
    command.emplace_back("-h");
    int retVal = 0;
    const bool runResult = cmSystemTools::RunSingleCommand(
      command, &stdOut, &stdErr, &retVal, nullptr, cmSystemTools::OUTPUT_NONE,
      cmDuration::zero(), cmProcessOutput::Auto);
    if (!runResult) {
      error = "Test run of \"";
      error += generator;
      error += "\" executable ";
      error += cmQtAutoGen::Quoted(executable) + " failed.\n";
      error += cmQtAutoGen::QuotedCommand(command);
      error += "\n";
      error += stdOut;
      error += "\n";
      error += stdErr;
      return false;
    }
  }

  // Return executable output on demand
  if (output != nullptr) {
    *output = stdOut;
  }

  // Register executable and output
  this->ExecutableTestOutputs_.emplace(executable, std::move(stdOut));

  return true;
}